

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

object_task<lzham::lzcompressor> * __thiscall
lzham::
lzham_new<lzham::object_task<lzham::lzcompressor>,void*,lzham::lzcompressor*,void(lzham::lzcompressor::*)(unsigned_long_long,void*),lzham::object_task_flags>
          (lzham_malloc_context context,void **init0,lzcompressor **init1,
          offset_in_lzcompressor_to_subr *init2,object_task_flags *init3)

{
  ulong *in_RCX;
  lzham *in_RDI;
  object_task<lzham::lzcompressor> *in_R8;
  object_task<lzham::lzcompressor> *p;
  uint in_stack_ffffffffffffffac;
  object_task<lzham::lzcompressor> *local_8;
  
  local_8 = (object_task<lzham::lzcompressor> *)lzham::lzham_malloc(in_RDI,(void *)0x30,0,in_RCX);
  if (local_8 == (object_task<lzham::lzcompressor> *)0x0) {
    local_8 = (object_task<lzham::lzcompressor> *)0x0;
  }
  else {
    object_task<lzham::lzcompressor>::object_task
              (in_R8,local_8,(lzcompressor *)in_RCX[1],(object_method_ptr)local_8,
               in_stack_ffffffffffffffac);
  }
  return local_8;
}

Assistant:

inline T* lzham_new(lzham_malloc_context context, const A& init0, const B& init1, const C& init2, const D& init3)
   {
      T* p = static_cast<T*>(lzham_malloc(context, sizeof(T)));
      if (!p) return NULL;
      return new (static_cast<void*>(p)) T(init0, init1, init2, init3); 
   }